

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.cpp
# Opt level: O1

vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> * __thiscall
cfd::CoinSelection::KnapsackSolver
          (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *__return_storage_ptr__,CoinSelection *this
          ,int64_t *target_value,vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *utxos,
          uint64_t min_change,int64_t *select_value,Amount *utxo_fee_value)

{
  pointer ppUVar1;
  Utxo *pUVar2;
  long lVar3;
  iterator iVar4;
  Utxo *pUVar5;
  unkbyte9 Var6;
  pointer ppUVar7;
  uint64_t *puVar8;
  CoinSelection *this_00;
  CfdException *this_01;
  uint uVar9;
  long n_total_value;
  uint64_t uVar10;
  Utxo **ppUVar11;
  Utxo **utxo;
  pointer ppUVar12;
  __normal_iterator<const_cfd::Utxo_**,_std::vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>_>
  __i;
  ulong uVar13;
  long lVar14;
  Utxo **ppUVar15;
  int64_t iVar16;
  Utxo *pUVar17;
  Amount AVar18;
  vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_> applicable_groups;
  int64_t n_best;
  vector<char,_std::allocator<char>_> vf_best;
  int64_t n_effective_total;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  vector<char,_std::allocator<char>_> vf_best2;
  int64_t n_best2;
  unsigned_long local_e0;
  vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_> local_d8;
  uint64_t *local_b8;
  unsigned_long local_b0;
  undefined1 local_a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  unsigned_long local_88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  undefined1 local_68 [16];
  char *local_58;
  Utxo **local_48;
  unsigned_long local_40;
  CoinSelection *local_38;
  
  (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0 = *target_value;
  local_a8._0_8_ = "cfd_utxo.cpp";
  local_a8._8_4_ = 0x2f8;
  local_98._M_allocated_capacity = 0x62adf3;
  core::logger::log<long&>
            ((CfdSourceLocation *)local_a8,kCfdLogLevelInfo,"KnapsackSolver start. target={}",
             (long *)&local_e0);
  local_d8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Utxo **)0x0;
  local_d8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>._M_impl.
  super__Vector_impl_data._M_start = (Utxo **)0x0;
  local_d8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (Utxo **)0x0;
  local_88 = 0;
  core::RandomNumberUtil::GetRandomIndexes
            (&local_80,
             (uint32_t)
             ((ulong)((long)(utxos->super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(utxos->super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>).
                           _M_impl.super__Vector_impl_data._M_start) >> 3));
  local_b8 = (uint64_t *)select_value;
  local_38 = this;
  if (local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    n_total_value = 0;
    pUVar17 = (Utxo *)0x0;
  }
  else {
    pUVar17 = (Utxo *)0x0;
    n_total_value = 0;
    uVar13 = 0;
    do {
      ppUVar1 = (utxos->super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pUVar2 = ppUVar1[uVar13];
      if (pUVar2->effective_k_value == local_e0) {
        iVar4._M_current =
             (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<cfd::Utxo,std::allocator<cfd::Utxo>>::_M_realloc_insert<cfd::Utxo_const&>
                    ((vector<cfd::Utxo,std::allocator<cfd::Utxo>> *)__return_storage_ptr__,iVar4,
                     pUVar2);
        }
        else {
          memcpy(iVar4._M_current,pUVar2,0xd8);
          (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
          _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        pUVar17 = (utxos->super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar13];
        *local_b8 = pUVar17->amount;
        AVar18 = core::Amount::CreateBySatoshiAmount(pUVar17->fee);
        utxo_fee_value->amount_ = AVar18.amount_;
        utxo_fee_value->ignore_check_ = AVar18.ignore_check_;
        local_a8._0_8_ = "cfd_utxo.cpp";
        local_a8._8_4_ = 0x30c;
        local_98._M_allocated_capacity = 0x62adf3;
        local_68._0_8_ =
             ((long)(__return_storage_ptr__->
                    super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(__return_storage_ptr__->
                    super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
        core::logger::log<unsigned_long&>
                  ((CfdSourceLocation *)local_a8,kCfdLogLevelInfo,"KnapsackSolver end. results={}",
                   (unsigned_long *)local_68);
        goto LAB_003e969b;
      }
      if (pUVar2->effective_k_value < (long)(local_e0 + min_change)) {
        if (local_d8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_d8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<cfd::Utxo_const*,std::allocator<cfd::Utxo_const*>>::
          _M_realloc_insert<cfd::Utxo_const*const&>
                    ((vector<cfd::Utxo_const*,std::allocator<cfd::Utxo_const*>> *)&local_d8,
                     (iterator)
                     local_d8.
                     super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,ppUVar1 + uVar13);
        }
        else {
          *local_d8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
           _M_impl.super__Vector_impl_data._M_finish = pUVar2;
          local_d8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>._M_impl
          .super__Vector_impl_data._M_finish =
               local_d8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        lVar3 = (utxos->super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar13]->effective_k_value;
        lVar14 = 0;
        if (0 < lVar3) {
          lVar14 = lVar3;
        }
        n_total_value = n_total_value + lVar14;
        local_88 = local_88 + lVar3;
      }
      else if ((pUVar17 == (Utxo *)0x0) || (pUVar2->amount < pUVar17->amount)) {
        pUVar17 = pUVar2;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < (ulong)((long)local_80.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_80.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  puVar8 = local_b8;
  ppUVar7 = local_d8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (local_88 == local_e0) {
    if (local_d8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_d8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar10 = 0;
      iVar16 = 0;
    }
    else {
      iVar16 = 0;
      uVar10 = 0;
      ppUVar12 = local_d8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      do {
        iVar4._M_current =
             (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<cfd::Utxo,std::allocator<cfd::Utxo>>::_M_realloc_insert<cfd::Utxo_const&>
                    ((vector<cfd::Utxo,std::allocator<cfd::Utxo>> *)__return_storage_ptr__,iVar4,
                     *ppUVar12);
        }
        else {
          memcpy(iVar4._M_current,*ppUVar12,0xd8);
          (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
          _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        uVar10 = uVar10 + (*ppUVar12)->amount;
        iVar16 = iVar16 + (*ppUVar12)->fee;
        ppUVar12 = ppUVar12 + 1;
      } while (ppUVar12 != ppUVar7);
    }
    *local_b8 = uVar10;
    AVar18 = core::Amount::CreateBySatoshiAmount(iVar16);
    utxo_fee_value->amount_ = AVar18.amount_;
    utxo_fee_value->ignore_check_ = AVar18.ignore_check_;
    local_a8._0_8_ = "cfd_utxo.cpp";
    local_a8._8_4_ = 0x32a;
    local_98._M_allocated_capacity = 0x62adf3;
    local_68._0_8_ =
         ((long)(__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
                _M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
    core::logger::log<unsigned_long&>
              ((CfdSourceLocation *)local_a8,kCfdLogLevelInfo,"KnapsackSolver end. results={}",
               (unsigned_long *)local_68);
  }
  else if (n_total_value < (long)local_e0) {
    if (pUVar17 == (Utxo *)0x0) {
      local_a8._0_8_ = "cfd_utxo.cpp";
      local_a8._8_4_ = 0x332;
      local_98._M_allocated_capacity = 0x62adf3;
      core::logger::log<long&,long&>
                ((CfdSourceLocation *)local_a8,kCfdLogLevelWarning,
                 "insufficient funds. effective_total:{} target:{}",(long *)&local_88,
                 (long *)&local_e0);
      this_01 = (CfdException *)__cxa_allocate_exception(0x30);
      local_a8._0_8_ = &local_98;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"insufficient funds.","");
      core::CfdException::CfdException(this_01,kCfdIllegalStateError,(string *)local_a8);
      __cxa_throw(this_01,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    iVar4._M_current =
         (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl
         .super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<cfd::Utxo,std::allocator<cfd::Utxo>>::_M_realloc_insert<cfd::Utxo_const&>
                ((vector<cfd::Utxo,std::allocator<cfd::Utxo>> *)__return_storage_ptr__,iVar4,pUVar17
                );
    }
    else {
      memcpy(iVar4._M_current,pUVar17,0xd8);
      (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current + 1;
    }
    *puVar8 = pUVar17->amount;
    AVar18 = core::Amount::CreateBySatoshiAmount(pUVar17->fee);
    utxo_fee_value->amount_ = AVar18.amount_;
    utxo_fee_value->ignore_check_ = AVar18.ignore_check_;
    local_a8._0_8_ = "cfd_utxo.cpp";
    local_a8._8_4_ = 0x33b;
    local_98._M_allocated_capacity = 0x62adf3;
    local_68._0_8_ =
         ((long)(__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
                _M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
    core::logger::log<unsigned_long&>
              ((CfdSourceLocation *)local_a8,kCfdLogLevelInfo,"KnapsackSolver end. results={}",
               (unsigned_long *)local_68);
  }
  else {
    if (local_d8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_d8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar14 = (long)local_d8.
                     super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_d8.
                     super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      uVar13 = lVar14 >> 3;
      lVar3 = 0x3f;
      if (uVar13 != 0) {
        for (; uVar13 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      local_48 = local_d8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<cfd::Utxo_const**,std::vector<cfd::Utxo_const*,std::allocator<cfd::Utxo_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<cfd::CoinSelection::KnapsackSolver(long_const&,std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>const&,unsigned_long,long*,cfd::core::Amount*)::__0>>
                (local_d8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 local_d8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar14 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<cfd::Utxo_const**,std::vector<cfd::Utxo_const*,std::allocator<cfd::Utxo_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cfd::CoinSelection::KnapsackSolver(long_const&,std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>const&,unsigned_long,long*,cfd::core::Amount*)::__0>>
                  (local_48,ppUVar7);
      }
      else {
        ppUVar15 = local_48 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<cfd::Utxo_const**,std::vector<cfd::Utxo_const*,std::allocator<cfd::Utxo_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cfd::CoinSelection::KnapsackSolver(long_const&,std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>const&,unsigned_long,long*,cfd::core::Amount*)::__0>>
                  (local_48,ppUVar15);
        for (; ppUVar15 != ppUVar7; ppUVar15 = ppUVar15 + 1) {
          pUVar2 = ppUVar15[-1];
          pUVar5 = *ppUVar15;
          lVar3 = pUVar5->effective_k_value;
          lVar14 = pUVar2->effective_k_value;
          ppUVar11 = ppUVar15;
          while (lVar14 < lVar3) {
            *ppUVar11 = pUVar2;
            pUVar2 = ppUVar11[-2];
            ppUVar11 = ppUVar11 + -1;
            lVar14 = pUVar2->effective_k_value;
          }
          *ppUVar11 = pUVar5;
        }
      }
    }
    this_00 = local_38;
    local_a8._0_8_ = (char *)0x0;
    local_a8._8_8_ = (pointer)0x0;
    local_98._M_allocated_capacity = 0;
    (local_38->randomize_cache_).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
         (local_38->randomize_cache_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    (local_38->randomize_cache_).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    ApproximateBestSubset
              (local_38,&local_d8,n_total_value,local_e0,
               (vector<char,_std::allocator<char>_> *)local_a8,(int64_t *)&local_b0,100000);
    if ((local_b0 != local_e0) && ((long)(local_e0 + min_change) <= n_total_value)) {
      local_40 = local_b0;
      local_68._0_8_ = (pointer)0x0;
      local_68._8_8_ = (pointer)0x0;
      local_58 = (char *)0x0;
      ApproximateBestSubset
                (this_00,&local_d8,n_total_value,local_e0 + min_change,
                 (vector<char,_std::allocator<char>_> *)local_68,(int64_t *)&local_40,100000);
      if ((local_40 == local_e0) || ((long)local_40 < (long)local_b0)) {
        local_b0 = local_40;
        std::vector<char,_std::allocator<char>_>::operator=
                  ((vector<char,_std::allocator<char>_> *)local_a8,
                   (vector<char,_std::allocator<char>_> *)local_68);
      }
      if ((pointer)local_68._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_68._0_8_,(long)local_58 - local_68._0_8_);
      }
    }
    if ((pUVar17 == (Utxo *)0x0) ||
       ((local_b0 == local_e0 || (long)(min_change + local_e0) <= (long)local_b0 &&
        ((long)local_b0 < pUVar17->effective_k_value)))) {
      if (local_d8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>._M_impl
          .super__Vector_impl_data._M_finish ==
          local_d8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>._M_impl
          .super__Vector_impl_data._M_start) {
        iVar16 = 0;
        uVar10 = 0;
      }
      else {
        uVar9 = 1;
        uVar13 = 0;
        uVar10 = 0;
        iVar16 = 0;
        do {
          if (*(char *)(local_a8._0_8_ + uVar13) != '\0') {
            iVar4._M_current =
                 (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<cfd::Utxo,std::allocator<cfd::Utxo>>::_M_realloc_insert<cfd::Utxo_const&>
                        ((vector<cfd::Utxo,std::allocator<cfd::Utxo>> *)__return_storage_ptr__,iVar4
                         ,local_d8.
                          super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar13]);
            }
            else {
              memcpy(iVar4._M_current,
                     local_d8.
                     super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar13],0xd8);
              (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
              _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
            }
            uVar10 = uVar10 + local_d8.
                              super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar13]->amount;
            iVar16 = iVar16 + local_d8.
                              super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar13]->fee;
          }
          uVar13 = (ulong)uVar9;
          uVar9 = uVar9 + 1;
        } while (uVar13 < (ulong)((long)local_d8.
                                        super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_d8.
                                        super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      *local_b8 = uVar10;
      AVar18 = core::Amount::CreateBySatoshiAmount(iVar16);
      Var6 = AVar18._0_9_;
    }
    else {
      iVar4._M_current =
           (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<cfd::Utxo,std::allocator<cfd::Utxo>>::_M_realloc_insert<cfd::Utxo_const&>
                  ((vector<cfd::Utxo,std::allocator<cfd::Utxo>> *)__return_storage_ptr__,iVar4,
                   pUVar17);
      }
      else {
        memcpy(iVar4._M_current,pUVar17,0xd8);
        (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      *local_b8 = pUVar17->amount;
      AVar18 = core::Amount::CreateBySatoshiAmount(pUVar17->fee);
      Var6 = AVar18._0_9_;
    }
    utxo_fee_value->amount_ = (int64_t)Var6;
    utxo_fee_value->ignore_check_ = SUB91((unkuint9)Var6 >> 0x40,0);
    local_68._0_8_ = "cfd_utxo.cpp";
    local_68._8_4_ = 0x36d;
    local_58 = "KnapsackSolver";
    local_40 = ((long)(__return_storage_ptr__->
                      super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(__return_storage_ptr__->
                      super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
    core::logger::log<unsigned_long&>
              ((CfdSourceLocation *)local_68,kCfdLogLevelInfo,"KnapsackSolver end. results={}",
               &local_40);
    if ((char *)local_a8._0_8_ != (char *)0x0) {
      operator_delete((void *)local_a8._0_8_,local_98._M_allocated_capacity - local_a8._0_8_);
    }
  }
LAB_003e969b:
  if (local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>._M_impl.
      super__Vector_impl_data._M_start != (Utxo **)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.
                          super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.
                          super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Utxo> CoinSelection::KnapsackSolver(
    const int64_t& target_value, const std::vector<Utxo*>& utxos,
    uint64_t min_change, int64_t* select_value, Amount* utxo_fee_value) {
  std::vector<Utxo> ret_utxos;
  int64_t n_target = target_value;
  int64_t n_min_change = static_cast<int64_t>(min_change);
  info(CFD_LOG_SOURCE, "KnapsackSolver start. target={}", n_target);

  // List of values less than target
  const Utxo* lowest_larger = nullptr;
  std::vector<const Utxo*> applicable_groups;
  // int64_t n_total = 0;
  int64_t n_effective_total = 0;  // amount excluding fee
  int64_t n_effective_total_max = 0;
  int64_t utxo_fee = 0;

  std::vector<uint32_t> indexes =
      RandomNumberUtil::GetRandomIndexes(static_cast<uint32_t>(utxos.size()));

  for (size_t index = 0; index < indexes.size(); ++index) {
    // if (utxos[index]->amount == n_target) {
    if (utxos[index]->effective_k_value == n_target) {
      // that meets the required value
      ret_utxos.push_back(*utxos[index]);
      *select_value = utxos[index]->amount;
      *utxo_fee_value = Amount::CreateBySatoshiAmount(utxos[index]->fee);
      info(CFD_LOG_SOURCE, "KnapsackSolver end. results={}", ret_utxos.size());
      return ret_utxos;

    } else if (utxos[index]->effective_k_value < n_target + n_min_change) {
      // } else if ((utxos[index]->amount < n_target + min_change) {
      applicable_groups.push_back(utxos[index]);
      // n_total += utxos[index]->amount;
      if (utxos[index]->effective_k_value > 0) {
        n_effective_total_max += utxos[index]->effective_k_value;
      }
      n_effective_total += utxos[index]->effective_k_value;

    } else if (
        lowest_larger == nullptr ||
        utxos[index]->amount < lowest_larger->amount) {
      // greater than `n_target + min_change`
      lowest_larger = utxos[index];
    }
  }

  // if (n_total == n_target) {
  if (n_effective_total == n_target) {
    uint64_t ret_value = 0;
    for (const auto& utxo : applicable_groups) {
      ret_utxos.push_back(*utxo);
      ret_value += utxo->amount;
      utxo_fee += utxo->fee;
    }
    *select_value = static_cast<int64_t>(ret_value);
    *utxo_fee_value = Amount::CreateBySatoshiAmount(utxo_fee);
    info(CFD_LOG_SOURCE, "KnapsackSolver end. results={}", ret_utxos.size());
    return ret_utxos;
  }

  // if (n_total < n_target) {
  if (n_effective_total_max < n_target) {
    if (lowest_larger == nullptr) {
      warn(
          CFD_LOG_SOURCE, "insufficient funds. effective_total:{} target:{}",
          n_effective_total, n_target);
      throw CfdException(
          CfdError::kCfdIllegalStateError, "insufficient funds.");
    }

    ret_utxos.push_back(*lowest_larger);
    *select_value = static_cast<int64_t>(lowest_larger->amount);
    *utxo_fee_value = Amount::CreateBySatoshiAmount(lowest_larger->fee);
    info(CFD_LOG_SOURCE, "KnapsackSolver end. results={}", ret_utxos.size());
    return ret_utxos;
  }

  std::sort(
      applicable_groups.begin(), applicable_groups.end(),
      [](const Utxo* a, const Utxo* b) {
        return a->effective_k_value > b->effective_k_value;
      });
  std::vector<char> vf_best;
  int64_t n_best;

  randomize_cache_.clear();
  ApproximateBestSubset(
      applicable_groups, n_effective_total_max, n_target, &vf_best, &n_best,
      kApproximateBestSubsetIterations);
  if (n_best != n_target && n_effective_total_max >= n_target + n_min_change) {
    int64_t n_best2 = n_best;
    std::vector<char> vf_best2;
    ApproximateBestSubset(
        applicable_groups, n_effective_total_max, (n_target + n_min_change),
        &vf_best2, &n_best2, kApproximateBestSubsetIterations);
    if ((n_best2 == n_target) || (n_best > n_best2)) {
      n_best = n_best2;
      vf_best = vf_best2;
    }
  }

  // NOLINT If we have a bigger coin and (either the stochastic approximation didn't find a good solution,
  // NOLINT                                or the next bigger coin is closer), return the bigger coin
  if (lowest_larger != nullptr &&
      ((n_best != n_target && n_best < n_target + n_min_change) ||
       lowest_larger->effective_k_value <= n_best)) {
    // lowest_larger->amount <= n_best)) {
    ret_utxos.push_back(*lowest_larger);
    *select_value = static_cast<int64_t>(lowest_larger->amount);
    *utxo_fee_value = Amount::CreateBySatoshiAmount(lowest_larger->fee);

  } else {
    uint64_t ret_value = 0;
    for (unsigned int i = 0; i < applicable_groups.size(); i++) {
      if (vf_best[i]) {
        ret_utxos.push_back(*applicable_groups[i]);
        ret_value += applicable_groups[i]->amount;
        utxo_fee += applicable_groups[i]->fee;
      }
    }
    *select_value = static_cast<int64_t>(ret_value);
    *utxo_fee_value = Amount::CreateBySatoshiAmount(utxo_fee);
  }
  info(CFD_LOG_SOURCE, "KnapsackSolver end. results={}", ret_utxos.size());
  return ret_utxos;
}